

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_nvector_senswrapper.c
# Opt level: O1

realtype N_VMinQuotient_SensWrapper(N_Vector num,N_Vector denom)

{
  long *plVar1;
  long lVar2;
  realtype rVar3;
  realtype rVar4;
  
  rVar3 = N_VMinQuotient((N_Vector)**num->content,(N_Vector)**denom->content);
  plVar1 = (long *)num->content;
  if (1 < (int)plVar1[1]) {
    lVar2 = 1;
    rVar4 = rVar3;
    do {
      rVar3 = N_VMinQuotient(*(N_Vector *)(*plVar1 + lVar2 * 8),
                             *(N_Vector *)(*denom->content + lVar2 * 8));
      if (rVar4 <= rVar3) {
        rVar3 = rVar4;
      }
      lVar2 = lVar2 + 1;
      plVar1 = (long *)num->content;
      rVar4 = rVar3;
    } while (lVar2 < (int)plVar1[1]);
  }
  return rVar3;
}

Assistant:

realtype N_VMinQuotient_SensWrapper(N_Vector num, N_Vector denom)
{
  int i;
  realtype min, tmp;

  min = N_VMinQuotient(NV_VEC_SW(num,0), NV_VEC_SW(denom,0));

  for (i=1; i < NV_NVECS_SW(num); i++) {
    tmp = N_VMinQuotient(NV_VEC_SW(num,i), NV_VEC_SW(denom,i));
    if (tmp < min) min = tmp;
  }

  return(min);
}